

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view.cpp
# Opt level: O2

sstring_view<std::shared_ptr<const_char>_> *
pstore::make_shared_sstring_view
          (sstring_view<std::shared_ptr<const_char>_> *__return_storage_ptr__,czstring str)

{
  shared_ptr<const_char> *ptr;
  _func_int **__dest;
  undefined **length;
  __allocator_type __a2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<char_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_adt_sstring_view_cpp:34:54),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_38;
  
  ptr = (shared_ptr<const_char> *)strlen(str);
  __dest = (_func_int **)operator_new__((ulong)ptr);
  local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  local_38._M_alloc = &__a2;
  (local_40._M_pi)->_M_use_count = 1;
  (local_40._M_pi)->_M_weak_count = 1;
  length = &PTR___Sp_counted_base_00231c68;
  (local_40._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00231c68;
  local_40._M_pi[1]._vptr__Sp_counted_base = __dest;
  local_38._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<char_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/adt/sstring_view.cpp:34:54),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_38);
  if (ptr != (shared_ptr<const_char> *)0x0) {
    memcpy(__dest,str,(size_t)ptr);
  }
  std::static_pointer_cast<char_const,char>((shared_ptr<char> *)&local_38);
  make_shared_sstring_view<char_const>
            (__return_storage_ptr__,(pstore *)&local_38,ptr,(size_t)length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  return __return_storage_ptr__;
}

Assistant:

sstring_view<std::shared_ptr<char const>> make_shared_sstring_view (gsl::czstring const str) {
        auto const length = std::strlen (str);
        auto const ptr =
            std::shared_ptr<char> (new char[length], [] (gsl::czstring const p) { delete[] p; });
        std::copy (str, str + length, ptr.get ());
        return pstore::make_shared_sstring_view (std::static_pointer_cast<char const> (ptr),
                                                 length);
    }